

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O1

BlendEquation sglr::rr_util::mapGLBlendEquation(deUint32 equation)

{
  BlendEquation BVar1;
  
  BVar1 = BLENDEQUATION_LAST;
  if (equation - 0x8006 < 6) {
    BVar1 = *(BlendEquation *)(&DAT_00688b4c + (ulong)(equation - 0x8006) * 4);
  }
  return BVar1;
}

Assistant:

rr::BlendEquation mapGLBlendEquation (deUint32 equation)
{
	switch (equation)
	{
		case GL_FUNC_ADD:				return rr::BLENDEQUATION_ADD;
		case GL_FUNC_SUBTRACT:			return rr::BLENDEQUATION_SUBTRACT;
		case GL_FUNC_REVERSE_SUBTRACT:	return rr::BLENDEQUATION_REVERSE_SUBTRACT;
		case GL_MIN:					return rr::BLENDEQUATION_MIN;
		case GL_MAX:					return rr::BLENDEQUATION_MAX;
		default:
			DE_ASSERT(false);
			return rr::BLENDEQUATION_LAST;
	}
}